

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_ln.c
# Opt level: O1

cmd_ln_val_t * cmd_ln_val_init(int t,char *name,char *str)

{
  byte bVar1;
  byte *ptr;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  cmd_ln_val_t *pcVar6;
  size_t n;
  size_t sVar7;
  byte *pbVar8;
  uint uVar9;
  char *__s;
  ulong uVar10;
  bool bVar11;
  size_t alloced;
  char *resolved_str;
  anytype_t val;
  size_t local_a8;
  byte *local_a0;
  anytype_t local_98 [13];
  
  if (str == (char *)0x0) {
    local_98[0].ptr = (char *)0x0;
    goto LAB_00109b55;
  }
  local_a0 = (byte *)0x0;
  local_a8 = 0;
  pcVar5 = str;
  do {
    pcVar3 = strstr(pcVar5,"$(");
    if (pcVar3 == (char *)0x0) {
      n = 0;
      __s = pcVar5;
LAB_00109959:
      strnappend((char **)&local_a0,&local_a8,pcVar5,n);
    }
    else {
      if ((long)pcVar3 - (long)pcVar5 != 0) {
        strnappend((char **)&local_a0,&local_a8,pcVar5,(long)pcVar3 - (long)pcVar5);
        pcVar5 = pcVar3;
      }
      __s = pcVar5 + 2;
      pcVar4 = strchr(__s,0x29);
      if (pcVar4 == (char *)0x0) {
        n = 2;
        goto LAB_00109959;
      }
      sVar7 = (long)pcVar4 - (long)__s;
      if ((long)sVar7 < 100) {
        strncpy((char *)&local_98[0].i,__s,sVar7);
        *(undefined1 *)((long)local_98 + sVar7) = 0;
        pcVar5 = getenv((char *)&local_98[0].i);
        if (pcVar5 != (char *)0x0) {
          strnappend((char **)&local_a0,&local_a8,pcVar5,0);
        }
      }
      __s = pcVar4 + 1;
    }
    ptr = local_a0;
    pcVar5 = __s;
  } while (pcVar3 != (char *)0x0);
  switch(t) {
  case 2:
  case 3:
    iVar2 = __isoc99_sscanf(local_a0,"%ld",local_98);
    bVar11 = iVar2 != 1;
    break;
  case 4:
  case 5:
    if ((local_a0 == (byte *)0x0) || (*local_a0 == 0)) {
      bVar11 = true;
    }
    else {
      bVar11 = false;
    }
    local_98[0].fl = atof_c((char *)local_a0);
    break;
  case 8:
  case 9:
    local_98[0].ptr =
         __ckd_salloc__((char *)local_a0,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                        ,0x199);
    goto LAB_00109b48;
  case 0x10:
  case 0x11:
    bVar1 = *local_a0;
    uVar9 = bVar1 - 0x30;
    if (uVar9 < 0x3f) {
      if ((0x4040000040400001U >> ((ulong)uVar9 & 0x3f) & 1) == 0) {
        if ((0x21000000002U >> ((ulong)uVar9 & 0x3f) & 1) == 0) goto LAB_00109b35;
        goto LAB_00109b3f;
      }
      local_98[0].ptr = (char *)0x0;
    }
    else {
LAB_00109b35:
      if ((bVar1 != 0x79) && (bVar1 != 0x74)) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                ,0x193,"Unparsed boolean value \'%s\'\n",str);
        goto LAB_00109a8a;
      }
LAB_00109b3f:
      local_98[0].i = 1;
    }
LAB_00109b48:
    ckd_free(ptr);
    goto LAB_00109b55;
  default:
    if (t == 0x20) {
      uVar9 = 1;
      pbVar8 = local_a0;
      do {
        if (*pbVar8 == 0x2c) {
          uVar9 = uVar9 + 1;
        }
        else if (*pbVar8 == 0) goto LAB_00109a99;
        pbVar8 = pbVar8 + 1;
      } while( true );
    }
  case 6:
  case 7:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
            ,0x19f,"Unknown argument type: %d\n",(ulong)(uint)t);
LAB_00109a8a:
    ckd_free(ptr);
    goto LAB_00109a92;
  }
  ckd_free(ptr);
  if (bVar11) {
LAB_00109a92:
    pcVar6 = (cmd_ln_val_t *)0x0;
  }
  else {
LAB_00109b55:
    pcVar6 = (cmd_ln_val_t *)
             __ckd_calloc__(1,0x18,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                            ,0x1a8);
    pcVar6->val = local_98[0];
    pcVar6->type = t;
    pcVar5 = __ckd_salloc__(name,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                            ,0x1ab);
    pcVar6->name = pcVar5;
  }
  return pcVar6;
LAB_00109a99:
  local_98[0].ptr =
       __ckd_calloc__((long)(int)(uVar9 + 1),8,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                      ,0x161);
  if (0 < (int)uVar9) {
    uVar10 = 0;
    pbVar8 = ptr;
    do {
      for (sVar7 = 0; (pbVar8[sVar7] != 0 && (pbVar8[sVar7] != 0x2c)); sVar7 = sVar7 + 1) {
      }
      pcVar5 = (char *)__ckd_calloc__(sVar7 + 1 & 0xffffffff,1,
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                                      ,0x165);
      *(char **)(local_98[0].i + uVar10 * 8) = pcVar5;
      strncpy(pcVar5,(char *)pbVar8,sVar7);
      pbVar8 = pbVar8 + sVar7 + 1;
      uVar10 = uVar10 + 1;
    } while (uVar10 != uVar9);
  }
  goto LAB_00109b48;
}

Assistant:

static cmd_ln_val_t *
cmd_ln_val_init(int t, const char *name, const char *str)
{
    cmd_ln_val_t *v;
    anytype_t val;
    char *e_str;

    if (!str) {
        /* For lack of a better default value. */
        memset(&val, 0, sizeof(val));
    }
    else {
        int valid = 1;
        e_str = arg_resolve_env(str);

        switch (t) {
        case ARG_INTEGER:
        case REQARG_INTEGER:
            if (sscanf(e_str, "%ld", &val.i) != 1)
                valid = 0;
            break;
        case ARG_FLOATING:
        case REQARG_FLOATING:
            if (e_str == NULL || e_str[0] == 0)
            valid = 0;
            val.fl = atof_c(e_str);
            break;
        case ARG_BOOLEAN:
        case REQARG_BOOLEAN:
            if ((e_str[0] == 'y') || (e_str[0] == 't') ||
                (e_str[0] == 'Y') || (e_str[0] == 'T') || (e_str[0] == '1')) {
                val.i = TRUE;
            }
            else if ((e_str[0] == 'n') || (e_str[0] == 'f') ||
                     (e_str[0] == 'N') || (e_str[0] == 'F') |
                     (e_str[0] == '0')) {
                val.i = FALSE;
            }
            else {
                E_ERROR("Unparsed boolean value '%s'\n", str);
                valid = 0;
            }
            break;
        case ARG_STRING:
        case REQARG_STRING:
            val.ptr = ckd_salloc(e_str);
            break;
        case ARG_STRING_LIST:
            val.ptr = parse_string_list(e_str);
            break;
        default:
            E_ERROR("Unknown argument type: %d\n", t);
            valid = 0;
        }

        ckd_free(e_str);
        if (valid == 0)
            return NULL;
    }

    v = (cmd_ln_val_t *)ckd_calloc(1, sizeof(*v));
    memcpy(v, &val, sizeof(val));
    v->type = t;
    v->name = ckd_salloc(name);

    return v;
}